

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void * rw::wdgl::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  _DAT_00166680 = makeMatFXPipeline();
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	matFXGlobals.pipelines[PLATFORM_WDGL] = makeMatFXPipeline();
	return o;
}